

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::StartNewSlab
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  size_t sVar1;
  char *local_20;
  void *NewSlab;
  size_t AllocatedSlabSize;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  AllocatedSlabSize = (size_t)this;
  sVar1 = SmallVectorBase::size((SmallVectorBase *)&this->Slabs);
  NewSlab = (void *)computeSlabSize((uint)sVar1);
  local_20 = (char *)MallocAllocator::Allocate
                               ((MallocAllocator *)&this->field_0x60,(size_t)NewSlab,0);
  SmallVectorTemplateBase<void_*,_true>::push_back
            ((SmallVectorTemplateBase<void_*,_true> *)&this->Slabs,&local_20);
  this->CurPtr = local_20;
  this->End = local_20 + (long)NewSlab;
  return;
}

Assistant:

void StartNewSlab() {
    size_t AllocatedSlabSize = computeSlabSize(Slabs.size());

    void *NewSlab = Allocator.Allocate(AllocatedSlabSize, 0);
    // We own the new slab and don't want anyone reading anything other than
    // pieces returned from this method.  So poison the whole slab.
    __asan_poison_memory_region(NewSlab, AllocatedSlabSize);

    Slabs.push_back(NewSlab);
    CurPtr = (char *)(NewSlab);
    End = ((char *)NewSlab) + AllocatedSlabSize;
  }